

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

void __thiscall dg::DGLLVMPointerAnalysis::buildSubgraph(DGLLVMPointerAnalysis *this)

{
  undefined8 uVar1;
  char *in_RDI;
  raw_ostream *unaff_retaddr;
  char *Str;
  
  Str = in_RDI;
  std::
  unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
  ::operator->((unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                *)0x157f2f);
  uVar1 = dg::pta::LLVMPointerGraphBuilder::buildLLVMPointerGraph();
  *(undefined8 *)(in_RDI + 0x78) = uVar1;
  if (*(long *)(in_RDI + 0x78) == 0) {
    llvm::errs();
    llvm::raw_ostream::operator<<(unaff_retaddr,Str);
    abort();
  }
  return;
}

Assistant:

void buildSubgraph() {
        // run the analysis itself
        assert(_builder && "Incorrectly constructed PTA, missing builder");

        PS = _builder->buildLLVMPointerGraph();
        if (!PS) {
            llvm::errs() << "Pointer Subgraph was not built, aborting\n";
            abort();
        }

        /*
        pta::PointerGraphOptimizer optimizer(PS);
        optimizer.run();

        if (optimizer.getNumOfRemovedNodes() > 0)
            _builder->composeMapping(std::move(optimizer.getMapping()));

        llvm::errs() << "PS optimization removed " <<
        optimizer.getNumOfRemovedNodes() << " nodes\n";
        */
    }